

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O1

void __thiscall TC_parser<true>::maybeFeature(TC_parser<true> *this)

{
  v_array<char> *pvVar1;
  byte bVar2;
  uchar uVar3;
  size_t sVar4;
  example *peVar5;
  char *_begin;
  char *pcVar6;
  float *_begin_00;
  unsigned_long *_begin_01;
  substring s;
  substring sVar7;
  features *pfVar8;
  uint64_t uVar9;
  feature_index i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar10;
  uint64_t uVar11;
  pointer ppvVar12;
  features **ppfVar13;
  ostream *poVar14;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  byte *_begin_02;
  TC_parser<true> *pTVar22;
  byte *pbVar23;
  bool bVar24;
  float fVar25;
  substring sVar26;
  substring feature_name;
  v_array<char> feature_v;
  substring local_210;
  features *local_200;
  undefined1 local_1f8 [32];
  TC_parser<true> *local_1d8;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d0;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [376];
  
  local_210.begin = this->reading_head;
  bVar2 = *local_210.begin;
  if ((((bVar2 != 9) && (bVar2 != 0x20)) && (bVar2 != 0x7c)) &&
     (local_210.end = local_210.begin, bVar2 != 0xd && local_210.begin != this->endLine)) {
    while( true ) {
      bVar2 = *local_210.end;
      if ((((ulong)bVar2 < 0x3b) && ((0x400000100000200U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
         ((bVar2 == 0x7c || ((local_210.end == this->endLine || (bVar2 == 0xd)))))) break;
      this->reading_head = (char *)((byte *)local_210.end + 1);
      local_210.end = (char *)((byte *)local_210.end + 1);
    }
    local_200 = (features *)CONCAT44(local_200._4_4_,this->cur_channel_v);
    fVar25 = featureValue(this);
    this->v = fVar25 * local_200._0_4_;
    sVar7.end = local_210.end;
    sVar7.begin = local_210.begin;
    if (local_210.end == local_210.begin) {
      sVar4 = this->anon;
      this->anon = sVar4 + 1;
      i = sVar4 + this->channel_hash;
    }
    else {
      uVar9 = (*this->p->hasher)(sVar7,this->channel_hash);
      i = uVar9 & this->parse_mask;
    }
    fVar25 = this->v;
    if ((fVar25 != 0.0) || (NAN(fVar25))) {
      peVar5 = this->ae;
      bVar2 = this->index;
      features::push_back((peVar5->super_example_predict).feature_space + bVar2,fVar25,i);
      local_1a8._0_8_ = (_func_int **)0x0;
      local_1a8._8_8_ = 0;
      local_1b8._M_allocated_capacity = 0;
      local_1b8._8_8_ = 0;
      push_many<char>((v_array<char> *)&local_1b8,local_210.begin,
                      (long)local_210.end - (long)local_210.begin);
      local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffffffffff00;
      v_array<char>::push_back((v_array<char> *)&local_1b8,local_1f8);
      ppVar10 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)operator_new(0x40);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char_*&,_char_*&,_true>(ppVar10,&this->base,(char **)&local_1b8._M_allocated_capacity);
      local_1f8._0_8_ = ppVar10;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8),ppVar10);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&(peVar5->super_example_predict).feature_space[bVar2].space_names,
                  (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1f8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
      }
      if ((void *)local_1b8._M_allocated_capacity != (void *)0x0) {
        free((void *)local_1b8._M_allocated_capacity);
      }
      local_1d8 = this;
      if ((this->affix_features[this->index] != 0) && (local_210.end != local_210.begin)) {
        peVar5 = this->ae;
        if ((peVar5->super_example_predict).feature_space[0x84].values._end ==
            (peVar5->super_example_predict).feature_space[0x84].values._begin) {
          v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar5,&affix_namespace);
        }
        if (this->affix_features[this->index] != 0) {
          local_200 = (peVar5->super_example_predict).feature_space + 0x84;
          local_1d0 = &(peVar5->super_example_predict).feature_space[0x84].space_names;
          uVar9 = this->affix_features[this->index];
          do {
            pTVar22 = local_1d8;
            uVar15 = (uint)(uVar9 >> 1) & 7;
            pbVar16 = (byte *)(local_210.begin + uVar15);
            _begin_02 = (byte *)(local_210.end + -(ulong)uVar15);
            if (local_210.end <= pbVar16) {
              _begin_02 = (byte *)local_210.begin;
            }
            pbVar23 = (byte *)local_210.end;
            if ((uVar9 & 1) != 0) {
              pbVar23 = pbVar16;
              _begin_02 = (byte *)local_210.begin;
            }
            if (local_210.end <= pbVar16) {
              pbVar23 = (byte *)local_210.end;
            }
            sVar26.end = (char *)pbVar23;
            sVar26.begin = (char *)_begin_02;
            uVar11 = (*local_1d8->p->hasher)(sVar26,local_1d8->channel_hash);
            features::push_back(local_200,pTVar22->v,
                                ((ulong)((uint)uVar9 & 0xf) * 0x1aa5cfd + 0xd42855) * uVar11);
            local_1a8._0_8_ = (_func_int **)0x0;
            local_1a8._8_8_ = 0;
            local_1b8._M_allocated_capacity = 0;
            local_1b8._8_8_ = 0;
            uVar3 = pTVar22->index;
            if (uVar3 != ' ') {
              local_1f8[0] = uVar3;
              v_array<char>::push_back((v_array<char> *)&local_1b8,(char *)local_1f8);
            }
            local_1f8[0] = ((uVar9 & 1) == 0) * '\x02' + '+';
            v_array<char>::push_back((v_array<char> *)&local_1b8,(char *)local_1f8);
            local_1f8[0] = (byte)uVar15 | 0x30;
            v_array<char>::push_back((v_array<char> *)&local_1b8,(char *)local_1f8);
            local_1f8[0] = '=';
            v_array<char>::push_back((v_array<char> *)&local_1b8,(char *)local_1f8);
            push_many<char>((v_array<char> *)&local_1b8,(char *)_begin_02,
                            (long)pbVar23 - (long)_begin_02);
            local_1f8._0_8_ = (ulong)(uint7)local_1f8._1_7_ << 8;
            v_array<char>::push_back((v_array<char> *)&local_1b8,(char *)local_1f8);
            ppVar10 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)operator_new(0x40);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[6],_char_*&,_true>
                      (ppVar10,(char (*) [6])"affix",(char **)&local_1b8._M_allocated_capacity);
            local_1f8._0_8_ = ppVar10;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8),ppVar10);
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(local_1d0,
                        (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1f8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
            }
            bVar24 = 0xf < uVar9;
            uVar9 = uVar9 >> 4;
          } while (bVar24);
        }
      }
      pTVar22 = local_1d8;
      if (local_1d8->spelling_features[local_1d8->index] == true) {
        peVar5 = local_1d8->ae;
        if ((peVar5->super_example_predict).feature_space[0x85].values._end ==
            (peVar5->super_example_predict).feature_space[0x85].values._begin) {
          v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar5,&spelling_namespace);
        }
        v_array<char>::clear(&pTVar22->spelling);
        if (local_210.begin != local_210.end) {
          pbVar16 = (byte *)local_210.begin;
          do {
            local_1b8._M_allocated_capacity._1_7_ = (undefined7)((ulong)local_1b8._0_8_ >> 8);
            bVar2 = *pbVar16;
            if ((byte)(bVar2 - 0x30) < 10) {
              local_1b8._M_local_buf[0] = 0x30;
            }
            else if ((byte)(bVar2 + 0x9f) < 0x1a) {
              local_1b8._M_local_buf[0] = 0x61;
            }
            else if ((byte)(bVar2 + 0xbf) < 0x1a) {
              local_1b8._M_local_buf[0] = 0x41;
            }
            else if (bVar2 == 0x2e) {
              local_1b8._M_local_buf[0] = 0x2e;
            }
            else {
              local_1b8._M_local_buf[0] = 0x23;
            }
            v_array<char>::push_back(&pTVar22->spelling,local_1b8._M_local_buf);
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 != (byte *)local_210.end);
        }
        pTVar22 = local_1d8;
        pvVar1 = &local_1d8->spelling;
        _begin = pvVar1->_begin;
        pcVar6 = (local_1d8->spelling)._end;
        s.begin = pvVar1->_begin;
        s.end = pvVar1->_end;
        uVar9 = hashstring(s,local_1d8->channel_hash);
        features::push_back((peVar5->super_example_predict).feature_space + 0x85,pTVar22->v,uVar9);
        local_1a8._0_8_ = (_func_int **)0x0;
        local_1a8._8_8_ = 0;
        local_1b8._M_allocated_capacity = 0;
        local_1b8._8_8_ = 0;
        uVar3 = pTVar22->index;
        if (uVar3 != ' ') {
          local_1f8[0] = uVar3;
          v_array<char>::push_back((v_array<char> *)&local_1b8,local_1f8);
          local_1f8[0] = 0x5f;
          v_array<char>::push_back((v_array<char> *)&local_1b8,local_1f8);
        }
        push_many<char>((v_array<char> *)&local_1b8,_begin,(long)pcVar6 - (long)_begin);
        local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffffffffff00;
        v_array<char>::push_back((v_array<char> *)&local_1b8,local_1f8);
        ppVar10 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)operator_new(0x40);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_char_*&,_true>
                  (ppVar10,(char (*) [9])"spelling",(char **)&local_1b8._M_allocated_capacity);
        local_1f8._0_8_ = ppVar10;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8),ppVar10);
        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(&(peVar5->super_example_predict).feature_space[0x85].space_names,
                    (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1f8);
        pTVar22 = local_1d8;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
        }
      }
      if ((pTVar22->namespace_dictionaries[pTVar22->index].
           super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           pTVar22->namespace_dictionaries[pTVar22->index].
           super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
           ._M_impl.super__Vector_impl_data._M_start) &&
         (ppvVar12 = pTVar22->namespace_dictionaries[pTVar22->index].
                     super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
         pTVar22->namespace_dictionaries[pTVar22->index].
         super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish != ppvVar12)) {
        local_1d0 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x0;
        do {
          uVar15 = (int)local_210.end - (int)local_210.begin;
          uVar18 = uVar15;
          if ((int)uVar15 < 0) {
            uVar18 = uVar15 + 3;
          }
          pbVar16 = (byte *)(local_210.begin + (int)(uVar18 & 0xfffffffc));
          uVar21 = 0x1aa5cfd;
          if (6 < uVar15 + 3) {
            lVar20 = (long)-((int)uVar18 >> 2);
            do {
              uVar21 = ((uint)(*(int *)(pbVar16 + lVar20 * 4) * -0x3361d2af) >> 0x11 |
                       *(int *)(pbVar16 + lVar20 * 4) * 0x16a88000) * 0x1b873593 ^ uVar21;
              uVar21 = (uVar21 << 0xd | uVar21 >> 0x13) * 5 + 0xe6546b64;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 0);
          }
          uVar19 = 0;
          uVar18 = 0;
          switch(uVar15 & 3) {
          case 3:
            uVar18 = (uint)pbVar16[2] << 0x10;
          case 2:
            uVar19 = uVar18 | (uint)pbVar16[1] << 8;
          case 1:
            uVar21 = uVar21 ^ ((*pbVar16 ^ uVar19) * -0x3361d2af >> 0x11 |
                              (*pbVar16 ^ uVar19) * 0x16a88000) * 0x1b873593;
          }
          uVar15 = ((uVar21 ^ uVar15) >> 0x10 ^ uVar21 ^ uVar15) * -0x7a143595;
          uVar15 = (uVar15 >> 0xd ^ uVar15) * -0x3d4d51cb;
          ppfVar13 = v_hashmap<substring,_features_*>::get
                               (ppvVar12[(long)local_1d0],&local_210,
                                (ulong)(uVar15 >> 0x10 ^ uVar15));
          local_200 = *ppfVar13;
          if ((local_200 != (features *)0x0) &&
             ((local_200->values)._end != (local_200->values)._begin)) {
            peVar5 = pTVar22->ae;
            if ((peVar5->super_example_predict).feature_space[0x87].values._end ==
                (peVar5->super_example_predict).feature_space[0x87].values._begin) {
              v_array<unsigned_char>::push_back
                        ((v_array<unsigned_char> *)peVar5,&dictionary_namespace);
            }
            pfVar8 = local_200;
            _begin_00 = (local_200->values)._begin;
            push_many<float>(&(peVar5->super_example_predict).feature_space[0x87].values,_begin_00,
                             (long)(local_200->values)._end - (long)_begin_00 >> 2);
            _begin_01 = (pfVar8->indicies)._begin;
            push_many<unsigned_long>
                      (&(peVar5->super_example_predict).feature_space[0x87].indicies,_begin_01,
                       (long)(pfVar8->indicies)._end - (long)_begin_01 >> 3);
            (peVar5->super_example_predict).feature_space[0x87].sum_feat_sq =
                 pfVar8->sum_feat_sq +
                 (peVar5->super_example_predict).feature_space[0x87].sum_feat_sq;
            if ((pfVar8->indicies)._end != (pfVar8->indicies)._begin) {
              uVar17 = 0;
              do {
                std::__cxx11::stringstream::stringstream((stringstream *)local_1b8._M_local_buf);
                local_1f8[0] = pTVar22->index;
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(char *)local_1f8,1);
                local_1f8[0] = 0x5f;
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_1f8,1);
                for (pbVar16 = (byte *)local_210.begin; pbVar16 != (byte *)local_210.end;
                    pbVar16 = pbVar16 + 1) {
                  local_1f8[0] = *pbVar16;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_1f8,1);
                }
                local_1f8[0] = 0x3d;
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(char *)local_1f8,1);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
                ppVar10 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)operator_new(0x40);
                std::__cxx11::stringbuf::str();
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          (ppVar10,(char (*) [11])0x279c9c,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1f8);
                local_1c8.
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = ppVar10;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                          (&local_1c8.
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,ppVar10);
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(&(peVar5->super_example_predict).feature_space[0x87].space_names,
                            &local_1c8);
                pTVar22 = local_1d8;
                if (local_1c8.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_1c8.
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1f8._0_8_ !=
                    (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_1f8 + 0x10)) {
                  operator_delete((void *)local_1f8._0_8_);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8._M_local_buf);
                std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                uVar17 = uVar17 + 1;
              } while (uVar17 < (ulong)((long)(local_200->indicies)._end -
                                        (long)(local_200->indicies)._begin >> 3));
            }
          }
          local_1d0 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)((long)local_1d0 + 1);
          ppvVar12 = pTVar22->namespace_dictionaries[pTVar22->index].
                     super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        } while (local_1d0 <
                 (ulong)((long)pTVar22->namespace_dictionaries[pTVar22->index].
                               super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar12 >> 3));
      }
    }
  }
  return;
}

Assistant:

inline void maybeFeature()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
    {
      // maybeFeature --> ø
    }
    else
    {
      // maybeFeature --> 'String' FeatureValue
      substring feature_name = read_name();
      v = cur_channel_v * featureValue();
      uint64_t word_hash;
      if (feature_name.end != feature_name.begin)
        word_hash = (p->hasher(feature_name, channel_hash) & parse_mask);
      else
        word_hash = channel_hash + anon++;
      if (v == 0)
        return;  // dont add 0 valued features to list of features
      features& fs = ae->feature_space[index];
      fs.push_back(v, word_hash);
      if (audit)
      {
        v_array<char> feature_v = v_init<char>();
        push_many(feature_v, feature_name.begin, feature_name.end - feature_name.begin);
        feature_v.push_back('\0');
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(base, feature_v.begin())));
        feature_v.delete_v();
      }
      if ((affix_features[index] > 0) && (feature_name.end != feature_name.begin))
      {
        features& affix_fs = ae->feature_space[affix_namespace];
        if (affix_fs.size() == 0)
          ae->indices.push_back(affix_namespace);
        uint64_t affix = affix_features[index];
        while (affix > 0)
        {
          bool is_prefix = affix & 0x1;
          uint64_t len = (affix >> 1) & 0x7;
          substring affix_name = {feature_name.begin, feature_name.end};
          if (affix_name.end > affix_name.begin + len)
          {
            if (is_prefix)
              affix_name.end = affix_name.begin + len;
            else
              affix_name.begin = affix_name.end - len;
          }
          word_hash =
              p->hasher(affix_name, (uint64_t)channel_hash) * (affix_constant + (affix & 0xF) * quadratic_constant);
          affix_fs.push_back(v, word_hash);
          if (audit)
          {
            v_array<char> affix_v = v_init<char>();
            if (index != ' ')
              affix_v.push_back(index);
            affix_v.push_back(is_prefix ? '+' : '-');
            affix_v.push_back('0' + (char)len);
            affix_v.push_back('=');
            push_many(affix_v, affix_name.begin, affix_name.end - affix_name.begin);
            affix_v.push_back('\0');
            affix_fs.space_names.push_back(audit_strings_ptr(new audit_strings("affix", affix_v.begin())));
          }
          affix >>= 4;
        }
      }
      if (spelling_features[index])
      {
        features& spell_fs = ae->feature_space[spelling_namespace];
        if (spell_fs.size() == 0)
          ae->indices.push_back(spelling_namespace);
        // v_array<char> spelling;
        spelling.clear();
        for (char* c = feature_name.begin; c != feature_name.end; ++c)
        {
          char d = 0;
          if ((*c >= '0') && (*c <= '9'))
            d = '0';
          else if ((*c >= 'a') && (*c <= 'z'))
            d = 'a';
          else if ((*c >= 'A') && (*c <= 'Z'))
            d = 'A';
          else if (*c == '.')
            d = '.';
          else
            d = '#';
          // if ((spelling.size() == 0) || (spelling.last() != d))
          spelling.push_back(d);
        }
        substring spelling_ss = {spelling.begin(), spelling.end()};
        uint64_t word_hash = hashstring(spelling_ss, (uint64_t)channel_hash);
        spell_fs.push_back(v, word_hash);
        if (audit)
        {
          v_array<char> spelling_v = v_init<char>();
          if (index != ' ')
          {
            spelling_v.push_back(index);
            spelling_v.push_back('_');
          }
          push_many(spelling_v, spelling_ss.begin, spelling_ss.end - spelling_ss.begin);
          spelling_v.push_back('\0');
          spell_fs.space_names.push_back(audit_strings_ptr(new audit_strings("spelling", spelling_v.begin())));
        }
      }
      if (namespace_dictionaries[index].size() > 0)
      {
        for (size_t dict = 0; dict < namespace_dictionaries[index].size(); dict++)
        {
          feature_dict* map = namespace_dictionaries[index][dict];
          uint64_t hash = uniform_hash(feature_name.begin, feature_name.end - feature_name.begin, quadratic_constant);
          features* feats = map->get(feature_name, hash);
          if ((feats != nullptr) && (feats->values.size() > 0))
          {
            features& dict_fs = ae->feature_space[dictionary_namespace];
            if (dict_fs.size() == 0)
              ae->indices.push_back(dictionary_namespace);
            push_many(dict_fs.values, feats->values.begin(), feats->values.size());
            push_many(dict_fs.indicies, feats->indicies.begin(), feats->indicies.size());
            dict_fs.sum_feat_sq += feats->sum_feat_sq;
            if (audit)
              for (size_t i = 0; i < feats->indicies.size(); ++i)
              {
                uint64_t id = feats->indicies[i];
                stringstream ss;
                ss << index << '_';
                for (char* fc = feature_name.begin; fc != feature_name.end; ++fc) ss << *fc;
                ss << '=' << id;
                dict_fs.space_names.push_back(audit_strings_ptr(new audit_strings("dictionary", ss.str())));
              }
          }
        }
      }
    }
  }